

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O3

int MAFSA_automaton_str_to_int(MAFSA_letter *l,size_t sz_l,MAFSA_letter delim,int *out)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  
  iVar1 = 0;
  sVar4 = 0;
  sVar5 = sVar4;
  if (sz_l != 0) {
    do {
      sVar5 = sVar4;
      if (l[sVar4] == delim) break;
      sVar4 = sVar4 + 1;
      sVar5 = sz_l;
    } while (sz_l != sVar4);
  }
  uVar2 = ((int)sz_l + ~(uint)sVar5) - 1;
  if (-1 < (int)uVar2) {
    lVar3 = (ulong)uVar2 + 1;
    iVar1 = 0;
    do {
      iVar1 = iVar1 * (uint)delim + (uint)l[lVar3 + sVar5];
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  *out = iVar1;
  return 0;
}

Assistant:

extern int MAFSA_automaton_str_to_int(const MAFSA_letter *l,
    size_t sz_l, MAFSA_letter delim, int *out)
{
    int i;

    for (i = 0; i < sz_l; ++i)
    {
        if (delim == l[i])
        {
            break;
        }
    }

    return MAFSA_automaton_val_to_int(l + i + 1,
        sz_l - i - 1, delim, out);
}